

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O3

bool llvm::isCurrentDebugType(char *DebugType)

{
  char *pcVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d;
  char *pcVar3;
  bool bVar4;
  
  if (CurrentDebugType_abi_cxx11_ == (long *)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              ((ManagedStaticBase *)&CurrentDebugType_abi_cxx11_,
               object_creator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::call,object_deleter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::call);
  }
  if (*CurrentDebugType_abi_cxx11_ == CurrentDebugType_abi_cxx11_[1]) {
    bVar4 = true;
  }
  else {
    if (CurrentDebugType_abi_cxx11_ == (long *)0x0) {
      ManagedStaticBase::RegisterManagedStatic
                ((ManagedStaticBase *)&CurrentDebugType_abi_cxx11_,
                 object_creator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::call,object_deleter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::call);
    }
    pcVar3 = (char *)*CurrentDebugType_abi_cxx11_;
    pcVar1 = (char *)CurrentDebugType_abi_cxx11_[1];
    if (pcVar3 == pcVar1) {
      bVar4 = false;
    }
    else {
      do {
        iVar2 = std::__cxx11::string::compare(pcVar3);
        bVar4 = iVar2 == 0;
        if (bVar4) {
          return bVar4;
        }
        pcVar3 = pcVar3 + 0x20;
      } while (pcVar3 != pcVar1);
    }
  }
  return bVar4;
}

Assistant:

bool isCurrentDebugType(const char *DebugType) {
  if (CurrentDebugType->empty())
    return true;
  // See if DebugType is in list. Note: do not use find() as that forces us to
  // unnecessarily create an std::string instance.
  for (auto &d : *CurrentDebugType) {
    if (d == DebugType)
      return true;
  }
  return false;
}